

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O3

void ver_boundary_overlap
               (int *left_block,int left_stride,int *right_block,int right_stride,int *dst_block,
               int dst_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  
  iVar2 = grain_max;
  iVar1 = grain_min;
  if (width == 1) {
    if (height != 0) {
      do {
        iVar4 = *left_block * 0x17 + *right_block * 0x16 + 0x10 >> 5;
        iVar5 = iVar2;
        if (iVar4 < iVar2) {
          iVar5 = iVar4;
        }
        if (iVar4 < iVar1) {
          iVar5 = iVar1;
        }
        *dst_block = iVar5;
        left_block = left_block + (uint)left_stride;
        right_block = right_block + (uint)right_stride;
        dst_block = dst_block + (uint)dst_stride;
        height = height + -1;
      } while (height != 0);
    }
  }
  else if (height != 0) {
    piVar7 = dst_block + 1;
    piVar3 = right_block + 1;
    piVar6 = left_block + 1;
    do {
      iVar4 = piVar6[-1] * 0x1b + piVar3[-1] * 0x11 + 0x10 >> 5;
      iVar5 = iVar2;
      if (iVar4 < iVar2) {
        iVar5 = iVar4;
      }
      if (iVar4 < iVar1) {
        iVar5 = iVar1;
      }
      piVar7[-1] = iVar5;
      iVar4 = *piVar3 * 0x1b + *piVar6 * 0x11 + 0x10 >> 5;
      iVar5 = iVar2;
      if (iVar4 < iVar2) {
        iVar5 = iVar4;
      }
      if (iVar4 < iVar1) {
        iVar5 = iVar1;
      }
      *piVar7 = iVar5;
      piVar7 = piVar7 + (uint)dst_stride;
      piVar3 = piVar3 + (uint)right_stride;
      piVar6 = piVar6 + (uint)left_stride;
      height = height + -1;
    } while (height != 0);
  }
  return;
}

Assistant:

static void ver_boundary_overlap(int *left_block, int left_stride,
                                 int *right_block, int right_stride,
                                 int *dst_block, int dst_stride, int width,
                                 int height) {
  if (width == 1) {
    while (height) {
      *dst_block = clamp((*left_block * 23 + *right_block * 22 + 16) >> 5,
                         grain_min, grain_max);
      left_block += left_stride;
      right_block += right_stride;
      dst_block += dst_stride;
      --height;
    }
    return;
  } else if (width == 2) {
    while (height) {
      dst_block[0] = clamp((27 * left_block[0] + 17 * right_block[0] + 16) >> 5,
                           grain_min, grain_max);
      dst_block[1] = clamp((17 * left_block[1] + 27 * right_block[1] + 16) >> 5,
                           grain_min, grain_max);
      left_block += left_stride;
      right_block += right_stride;
      dst_block += dst_stride;
      --height;
    }
    return;
  }
}